

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Allocator.h
# Opt level: O0

void Memory::
     DeleteObject<Memory::JitArenaAllocator,(Memory::AllocatorDeleteFlags)0,JsUtil::BaseHashSet<InductionVariable,Memory::JitArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,unsigned_int,DefaultComparer,JsUtil::SimpleHashedEntry,JsUtil::NoResizeLock>>
               (AllocatorType *allocator,
               BaseHashSet<InductionVariable,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_unsigned_int,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
               *obj)

{
  size_t sVar1;
  long *plVar2;
  long extraout_RDX;
  code *local_40;
  FreeFuncType freeFunc;
  BaseHashSet<InductionVariable,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_unsigned_int,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
  *obj_local;
  AllocatorType *allocator_local;
  
  JsUtil::
  BaseHashSet<InductionVariable,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_unsigned_int,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
  ::~BaseHashSet(obj);
  local_40 = (code *)TypeAllocatorFunc<Memory::JitArenaAllocator,_JsUtil::BaseHashSet<InductionVariable,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_unsigned_int,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>_>
                     ::GetFreeFunc();
  plVar2 = (long *)((long)&(allocator->super_ArenaAllocator).
                           super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>.
                           super_Allocator.outOfMemoryFunc + extraout_RDX);
  if (((ulong)local_40 & 1) != 0) {
    local_40 = *(code **)(local_40 + *plVar2 + -1);
  }
  sVar1 = _AllocatorDelete<JsUtil::BaseHashSet<InductionVariable,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_unsigned_int,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>,_(Memory::AllocatorDeleteFlags)0>
          ::Size();
  (*local_40)(plVar2,obj,sVar1);
  return;
}

Assistant:

void DeleteObject(typename AllocatorInfo<TAllocator, T>::AllocatorType * allocator, T * obj)
{
    obj->~T();

    auto freeFunc = AllocatorInfo<TAllocator, T>::InstAllocatorFunc::GetFreeFunc(); // Use InstAllocatorFunc
    (allocator->*freeFunc)(
        (void*)obj, _AllocatorDelete<T, deleteFlags>::Size());
}